

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintExpressionContents::visitLoad(PrintExpressionContents *this,Load *curr)

{
  Type *this_00;
  byte bVar1;
  uint8_t uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  Type type;
  char *pcVar6;
  ostream *poVar7;
  Module *in_R8;
  Name name;
  char local_29;
  
  poVar7 = this->o;
  Colors::outputColorCode(poVar7,"\x1b[35m");
  Colors::outputColorCode(poVar7,"\x1b[1m");
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type;
  uVar4 = (uint)(curr->align).addr;
  type.id = 6;
  if (uVar4 < 0x10) {
    type.id = 3 - (ulong)(uVar4 < 8);
  }
  uVar3 = (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id;
  if (1 < uVar3) {
    type.id = uVar3;
  }
  wasm::operator<<(poVar7,type);
  if (curr->isAtomic == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o,".atomic",7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->o,".load",5);
  if (this_00->id == 1) goto LAB_00a3fc21;
  bVar1 = curr->bytes;
  uVar4 = wasm::Type::getByteSize(this_00);
  if (uVar4 <= bVar1) goto LAB_00a3fc21;
  uVar2 = curr->bytes;
  if (uVar2 == '\x04') {
    poVar7 = this->o;
    pcVar6 = "32";
LAB_00a3fbed:
    lVar5 = 2;
  }
  else if (uVar2 == '\x02') {
    poVar7 = this->o;
    if (this_00->id != 4) {
      pcVar6 = "16";
      goto LAB_00a3fbed;
    }
    pcVar6 = "_f16";
    lVar5 = 4;
  }
  else {
    if (uVar2 != '\x01') {
      abort();
    }
    poVar7 = this->o;
    pcVar6 = &local_29;
    local_29 = '8';
    lVar5 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,lVar5);
  if (this_00->id != 4) {
    pcVar6 = "i64.load32_u";
    if (curr->signed_ != false) {
      pcVar6 = "i64.load32_s";
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->o,pcVar6 + 10,2);
  }
LAB_00a3fc21:
  Colors::outputColorCode(this->o,"\x1b[0m");
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  if ((curr->offset).addr != 0) {
    poVar7 = this->o;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," offset=",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  }
  if ((curr->align).addr != (ulong)curr->bytes) {
    poVar7 = this->o;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," align=",7);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  }
  return;
}

Assistant:

void visitLoad(Load* curr) {
    prepareColor(o) << forceConcrete(curr->type, curr->align);
    if (curr->isAtomic) {
      o << ".atomic";
    }
    o << ".load";
    if (curr->type != Type::unreachable &&
        curr->bytes < curr->type.getByteSize()) {
      if (curr->bytes == 1) {
        o << '8';
      } else if (curr->bytes == 2) {
        if (curr->type == Type::f32) {
          o << "_f16";
        } else {
          o << "16";
        }
      } else if (curr->bytes == 4) {
        o << "32";
      } else {
        abort();
      }
      if (curr->type != Type::f32) {
        o << (curr->signed_ ? "_s" : "_u");
      }
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
    if (curr->align != curr->bytes) {
      o << " align=" << curr->align;
    }
  }